

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_map_types.hpp
# Opt level: O3

pair<const_pstore::index::details::index_pointer,_unsigned_long> __thiscall
pstore::index::details::linear_node::
lookup<pstore::indirect_string,pstore::indirect_string,std::equal_to<pstore::indirect_string>,void>
          (linear_node *this,undefined8 db,indirect_string *key)

{
  span<unsigned_char,__1L> sp;
  bool bVar1;
  index_pointer iVar2;
  size_t __nbytes;
  long lVar3;
  unsigned_long uVar4;
  pair<const_pstore::index::details::index_pointer,_unsigned_long> pVar5;
  indirect_string existing_key;
  type uninit_buffer;
  undefined8 local_78;
  value_type local_70;
  indirect_string local_68;
  extent_type<_1L> in_stack_ffffffffffffffb8;
  pointer in_stack_ffffffffffffffc0;
  
  if (this->size_ != 0) {
    lVar3 = this->size_ << 3;
    uVar4 = 0;
    do {
      local_70 = this->leaves_[uVar4].a_;
      sp.storage_.data_ = in_stack_ffffffffffffffc0;
      sp.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffffb8.size_;
      local_78 = db;
      serialize::flood<_1l>(sp);
      serialize::serializer<pstore::indirect_string,_void>::read
                ((int)&local_78,&stack0xffffffffffffffb8,__nbytes);
      bVar1 = indirect_string::operator==(&local_68,key);
      if (bVar1) {
        iVar2 = (index_pointer)((index_pointer *)(this->leaves_ + uVar4))->internal_;
        goto LAB_00147014;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  uVar4 = 0xffffffffffffffff;
  iVar2.internal_ = (internal_node *)0x0;
LAB_00147014:
  pVar5.second = uVar4;
  pVar5.first.internal_ = iVar2.internal_;
  return pVar5;
}

Assistant:

auto linear_node::lookup (database const & db, OtherKeyType const & key,
                                      KeyEqual equal) const
                -> std::pair<index_pointer const, std::size_t> {
                // Linear search. TODO: perhaps we should sort the nodes and use a binary
                // search? This would require a template compare method.
                std::size_t cnum = 0;
                for (auto const & child : *this) {
                    KeyType const existing_key =
                        serialize::read<KeyType> (serialize::archive::database_reader{db, child});
                    if (equal (existing_key, key)) {
                        return {index_pointer{child}, cnum};
                    }
                    ++cnum;
                }
                // Not found
                return {index_pointer (), details::not_found};
            }